

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O3

MPP_RET __thiscall MppDevServer::bat_server_put(MppDevServer *this,MppClientType client_type)

{
  MppDevBatServ *server;
  list_head *plVar1;
  list_head *plVar2;
  pthread_mutex_t *__mutex;
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  server = this->mBatServer[client_type];
  if (server != (MppDevBatServ *)0x0) {
    this->mBatServer[client_type] = (MppDevBatServ *)0x0;
    if ((((server->batch_run != 0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "server->batch_run == 0","bat_server_put",0x2ea), (mpp_debug._3_1_ & 0x10) != 0
         )) || (((server->list_batch).next != &server->list_batch &&
                (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                            "list_empty(&server->list_batch)","bat_server_put",0x2eb),
                (mpp_debug._3_1_ & 0x10) != 0)))) ||
       ((server->pending_count != 0 &&
        (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                    "server->pending_count == 0","bat_server_put",0x2ec),
        (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_0017452d:
      abort();
    }
    if (server->timer != (MppTimer)0x0) {
      mpp_timer_put(server->timer);
      server->timer = (MppTimer)0x0;
    }
    plVar1 = (server->list_batch_free).next;
    if (server->batch_free == 0) {
      if ((plVar1 != &server->list_batch_free) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "list_empty(&server->list_batch_free)","bat_server_put",0x2f9),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0017452d;
    }
    else {
      while (plVar1 != &server->list_batch_free) {
        plVar2 = plVar1->next;
        batch_del(server,(MppDevBatTask *)&plVar1[-1].prev);
        plVar1 = plVar2;
      }
    }
    if (-1 < server->server_fd) {
      close(server->server_fd);
      server->server_fd = -1;
    }
    __mutex = (pthread_mutex_t *)server->lock;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex);
      operator_delete(__mutex,0x28);
      server->lock = (Mutex *)0x0;
    }
    mpp_osal_free("bat_server_put",server);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return MPP_OK;
}

Assistant:

MPP_RET MppDevServer::bat_server_put(MppClientType client_type)
{
    MppDevBatTask *batch, *n;
    MppDevBatServ *server = NULL;
    AutoMutex auto_lock(this);

    if (NULL == mBatServer[client_type])
        return MPP_OK;

    server = mBatServer[client_type];
    mBatServer[client_type] = NULL;

    mpp_assert(server->batch_run == 0);
    mpp_assert(list_empty(&server->list_batch));
    mpp_assert(server->pending_count == 0);

    /* stop thread first */
    if (server->timer) {
        mpp_timer_put(server->timer);
        server->timer = NULL;
    }

    if (server->batch_free) {
        list_for_each_entry_safe(batch, n, &server->list_batch_free, MppDevBatTask, link_server) {
            batch_del(server, batch);
        }
    } else {
        mpp_assert(list_empty(&server->list_batch_free));
    }

    if (server->server_fd >= 0) {
        close(server->server_fd);
        server->server_fd = -1;
    }
    if (server->lock) {
        delete server->lock;
        server->lock = NULL;
    }
    MPP_FREE(server);
    return MPP_OK;
}